

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  ImGuiViewport *pIVar3;
  byte bVar4;
  ImGuiContext *g;
  uint uVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 size_auto_fit;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  pIVar1 = GImGui;
  fVar7 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
    }
    fVar9 = (GImGui->Style).FramePadding.y;
    fVar7 = fVar9 + fVar9 + fVar7;
  }
  local_68 = ZEXT416((uint)fVar7);
  fVar7 = ImGuiWindow::MenuBarHeight(window);
  local_70 = (window->WindowPadding).x;
  local_70 = local_70 + local_70;
  local_6c = (window->WindowPadding).y;
  local_6c = local_6c + local_6c;
  fVar9 = size_contents->x + local_70;
  local_38 = ZEXT416((uint)fVar9);
  local_78.x = fVar9 + 0.0;
  local_28 = ZEXT416((uint)local_78.x);
  fVar9 = size_contents->y + local_6c + fVar7 + (float)local_68._0_4_;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    local_68._0_4_ = fVar7 + (float)local_68._0_4_;
    local_58 = (pIVar1->Style).WindowMinSize;
    fVar7 = local_58.y;
    local_48 = ZEXT416((uint)fVar9);
    if ((window->Flags & 0x14000000U) == 0) {
      uStack_50 = 0;
    }
    else {
      local_58.x = local_58.x;
      if (4.0 <= local_58.x) {
        local_58.x = 4.0;
      }
      local_58.y = fVar7;
      if (4.0 <= fVar7) {
        local_58.y = 4.0;
      }
      uStack_50 = CONCAT44(fVar7,fVar7);
    }
    pIVar3 = ImGui::GetMainViewport();
    fVar7 = (pIVar1->Style).DisplaySafeAreaPadding.x;
    fVar9 = (pIVar1->Style).DisplaySafeAreaPadding.y;
    fVar7 = (pIVar3->Size).x - (fVar7 + fVar7);
    fVar9 = (pIVar3->Size).y - (fVar9 + fVar9);
    uVar5 = -(uint)(fVar7 <= local_58.x);
    fVar8 = (float)(uVar5 & (uint)local_58.x | ~uVar5 & (uint)fVar7);
    uVar5 = -(uint)(fVar9 <= local_58.y);
    fVar7 = (float)(uVar5 & (uint)local_58.y | ~uVar5 & (uint)fVar9);
    if ((float)local_48._0_4_ <= fVar7) {
      fVar7 = (float)local_48._0_4_;
    }
    uVar5 = -(uint)(fVar8 < (float)local_38._0_4_);
    local_78.x = (float)(-(uint)((float)local_38._0_4_ < local_58.x) & (uint)local_58.x |
                        ~-(uint)((float)local_38._0_4_ < local_58.x) &
                        (~uVar5 & local_28._0_4_ | uVar5 & (uint)fVar8));
    local_78.y = (float)(-(uint)((float)local_48._0_4_ < local_58.y) & (uint)local_58.y |
                        ~-(uint)((float)local_48._0_4_ < local_58.y) & (uint)fVar7);
    IVar6 = CalcWindowSizeAfterConstraint(window,&local_78);
    if ((size_contents->x <= IVar6.x - local_70) || (bVar2 = 1, (window->Flags & 0x808U) != 0x800))
    {
      bVar2 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar6.y - local_6c) - (float)local_68._0_4_) ||
       (bVar4 = 1, (window->Flags & 8) != 0)) {
      bVar4 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    if (bVar2 != 0) {
      local_78.y = (pIVar1->Style).ScrollbarSize + local_78.y;
    }
    if (bVar4 != 0) {
      local_78.x = (pIVar1->Style).ScrollbarSize + local_78.x;
    }
  }
  else {
    local_78.y = fVar9;
  }
  return local_78;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}